

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

int i2d_PUBKEY(EVP_PKEY *a,uchar **pp)

{
  int iVar1;
  BIO_METHOD *type;
  long lVar2;
  BIO *unaff_retaddr;
  BUF_MEM *buf;
  BIO *out;
  OSSL_ENCODER_CTX *ctx;
  X509_PUBKEY *xpk;
  int ret;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  int in_stack_00000084;
  EVP_PKEY *in_stack_00000088;
  OSSL_ENCODER_CTX *in_stack_ffffffffffffffb8;
  undefined8 *local_40;
  BIO *local_38;
  OSSL_ENCODER_CTX *local_30;
  X509_PUBKEY *local_28;
  int local_1c;
  uchar **local_18;
  EVP_PKEY *local_10;
  int local_4;
  
  local_1c = -1;
  if (a == (EVP_PKEY *)0x0) {
    local_4 = 0;
  }
  else {
    local_18 = pp;
    local_10 = a;
    if (*(long *)&a->references == 0) {
      if (*(long *)&a[1].save_parameters != 0) {
        local_30 = OSSL_ENCODER_CTX_new_for_pkey
                             (in_stack_00000088,in_stack_00000084,in_stack_00000078,
                              in_stack_00000070,in_stack_00000068);
        type = BIO_s_mem();
        local_38 = BIO_new(type);
        local_40 = (undefined8 *)0x0;
        iVar1 = OSSL_ENCODER_CTX_get_num_encoders(in_stack_ffffffffffffffb8);
        if ((((iVar1 != 0) && (local_38 != (BIO *)0x0)) &&
            (iVar1 = OSSL_ENCODER_to_bio((OSSL_ENCODER_CTX *)buf,unaff_retaddr), iVar1 != 0)) &&
           ((lVar2 = BIO_ctrl(local_38,0x73,0,&local_40), 0 < lVar2 &&
            (local_1c = (int)*local_40, local_18 != (uchar **)0x0)))) {
          if (*local_18 == (uchar *)0x0) {
            *local_18 = (uchar *)local_40[1];
            *local_40 = 0;
            local_40[1] = 0;
          }
          else {
            memcpy(*local_18,(void *)local_40[1],(long)local_1c);
            *local_18 = *local_18 + local_1c;
          }
        }
        BIO_free(local_38);
        OSSL_ENCODER_CTX_free((OSSL_ENCODER_CTX *)0x2e00c6);
      }
    }
    else {
      local_28 = (X509_PUBKEY *)0x0;
      local_28 = X509_PUBKEY_new();
      if (local_28 == (X509_PUBKEY *)0x0) {
        return -1;
      }
      if ((*(long *)(*(long *)&local_10->references + 0x28) != 0) &&
         (iVar1 = (**(code **)(*(long *)&local_10->references + 0x28))(local_28,local_10),
         iVar1 != 0)) {
        local_28->pkey = local_10;
        local_1c = i2d_X509_PUBKEY(local_28,local_18);
        local_28->pkey = (EVP_PKEY *)0x0;
      }
      X509_PUBKEY_free(local_28);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int i2d_PUBKEY(const EVP_PKEY *a, unsigned char **pp)
{
    int ret = -1;

    if (a == NULL)
        return 0;
    if (a->ameth != NULL) {
        X509_PUBKEY *xpk = NULL;

        if ((xpk = X509_PUBKEY_new()) == NULL)
            return -1;

        /* pub_encode() only encode parameters, not the key itself */
        if (a->ameth->pub_encode != NULL && a->ameth->pub_encode(xpk, a)) {
            xpk->pkey = (EVP_PKEY *)a;
            ret = i2d_X509_PUBKEY(xpk, pp);
            xpk->pkey = NULL;
        }
        X509_PUBKEY_free(xpk);
    } else if (a->keymgmt != NULL) {
        OSSL_ENCODER_CTX *ctx =
            OSSL_ENCODER_CTX_new_for_pkey(a, EVP_PKEY_PUBLIC_KEY,
                                          "DER", "SubjectPublicKeyInfo",
                                          NULL);
        BIO *out = BIO_new(BIO_s_mem());
        BUF_MEM *buf = NULL;

        if (OSSL_ENCODER_CTX_get_num_encoders(ctx) != 0
            && out != NULL
            && OSSL_ENCODER_to_bio(ctx, out)
            && BIO_get_mem_ptr(out, &buf) > 0) {
            ret = buf->length;

            if (pp != NULL) {
                if (*pp == NULL) {
                    *pp = (unsigned char *)buf->data;
                    buf->length = 0;
                    buf->data = NULL;
                } else {
                    memcpy(*pp, buf->data, ret);
                    *pp += ret;
                }
            }
        }
        BIO_free(out);
        OSSL_ENCODER_CTX_free(ctx);
    }

    return ret;
}